

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void anon_unknown.dwarf_a3d2::do_encode_decode_lt_test<int>(int ekey1,int ekey2)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  key_encoder *pkVar4;
  Message *pMVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  int32_t in_ESI;
  int32_t in_EDI;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  int akey2;
  int akey1;
  key_decoder dec2;
  key_decoder dec1;
  AssertionResult gtest_ar_4;
  stringstream ss2;
  stringstream ss1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  key_view ikey2;
  key_view ikey1;
  key_encoder enc2;
  key_encoder enc1;
  AssertionResult gtest_ar;
  AssertHelper local_858;
  Message local_850;
  AssertionResult local_848;
  AssertHelper local_838;
  Message local_830;
  AssertionResult local_828;
  int32_t local_818;
  int32_t local_814;
  pointer local_810;
  size_t sStack_808;
  key_decoder local_7f8;
  pointer local_7e0;
  size_t sStack_7d8;
  key_decoder local_7d0;
  AssertHelper local_7b8;
  Message local_7b0;
  int local_7a4;
  pointer local_7a0;
  size_t sStack_798;
  pointer local_790;
  size_t sStack_788;
  int local_77c;
  AssertionResult local_778;
  undefined4 local_764;
  AssertHelper local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  Message local_718;
  ostream *local_710;
  pointer pbStack_708;
  ostream *local_700;
  pointer pbStack_6f8;
  stringstream local_6e8 [16];
  detail local_6d8 [376];
  stringstream local_560 [16];
  detail local_550 [376];
  pointer local_3d8;
  size_t local_3d0;
  pointer local_3c8;
  size_t local_3c0;
  AssertHelper local_3b8;
  Message local_3b0;
  int local_3a4;
  pointer local_3a0;
  size_t sStack_398;
  pointer local_390;
  size_t sStack_388;
  int local_37c;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  int local_354;
  pointer local_350;
  size_t sStack_348;
  pointer local_340;
  size_t sStack_338;
  int local_32c;
  AssertionResult local_328;
  AssertHelper local_318;
  Message local_310;
  int local_304;
  pointer local_300;
  size_t sStack_2f8;
  pointer local_2f0;
  size_t sStack_2e8;
  int local_2d4;
  AssertionResult local_2d0;
  key_view local_2c0;
  key_view local_2b0;
  key_encoder local_2a0;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 auStack_a0 [24];
  byte local_88 [8];
  undefined1 auStack_80 [24];
  AssertHelper local_68 [3];
  Message local_50;
  AssertionResult local_48;
  int32_t local_38;
  int32_t local_34 [11];
  
  local_38 = in_ESI;
  local_34[0] = in_EDI;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&local_48,"(ekey1)","(ekey2)",local_34,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message(&local_48);
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=(local_68,&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult(&local_48);
  auStack_a0._0_16_ = ZEXT816(0) << 0x40;
  auStack_80 = ZEXT824(0);
  local_100 = ZEXT1632(auStack_a0._0_16_);
  auStack_a0._16_8_ = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_180 = ZEXT1632(auStack_a0._0_16_);
  local_160 = local_180;
  local_140 = local_180;
  local_120 = local_180;
  local_e0 = local_100;
  local_c0 = local_100;
  unodb::key_encoder::key_encoder((key_encoder *)local_180);
  local_2a0.buf = (byte *)0x0;
  local_2a0.cap = 0;
  local_2a0.off = 0;
  local_2a0.ibuf[0xe0] = 0;
  local_2a0.ibuf[0xe1] = 0;
  local_2a0.ibuf[0xe2] = 0;
  local_2a0.ibuf[0xe3] = 0;
  local_2a0.ibuf[0xe4] = 0;
  local_2a0.ibuf[0xe5] = 0;
  local_2a0.ibuf[0xe6] = 0;
  local_2a0.ibuf[0xe7] = 0;
  local_2a0.ibuf[0xe8] = 0;
  local_2a0.ibuf[0xe9] = 0;
  local_2a0.ibuf[0xea] = 0;
  local_2a0.ibuf[0xeb] = 0;
  local_2a0.ibuf[0xec] = 0;
  local_2a0.ibuf[0xed] = 0;
  local_2a0.ibuf[0xee] = 0;
  local_2a0.ibuf[0xef] = 0;
  local_2a0.ibuf[0xf0] = 0;
  local_2a0.ibuf[0xf1] = 0;
  local_2a0.ibuf[0xf2] = 0;
  local_2a0.ibuf[0xf3] = 0;
  local_2a0.ibuf[0xf4] = 0;
  local_2a0.ibuf[0xf5] = 0;
  local_2a0.ibuf[0xf6] = 0;
  local_2a0.ibuf[0xf7] = 0;
  local_2a0.ibuf[0xf8] = 0;
  local_2a0.ibuf[0xf9] = 0;
  local_2a0.ibuf[0xfa] = 0;
  local_2a0.ibuf[0xfb] = 0;
  local_2a0.ibuf[0xfc] = 0;
  local_2a0.ibuf[0xfd] = 0;
  local_2a0.ibuf[0xfe] = 0;
  local_2a0.ibuf[0xff] = 0;
  local_2a0.ibuf[0xc0] = 0;
  local_2a0.ibuf[0xc1] = 0;
  local_2a0.ibuf[0xc2] = 0;
  local_2a0.ibuf[0xc3] = 0;
  local_2a0.ibuf[0xc4] = 0;
  local_2a0.ibuf[0xc5] = 0;
  local_2a0.ibuf[0xc6] = 0;
  local_2a0.ibuf[199] = 0;
  local_2a0.ibuf[200] = 0;
  local_2a0.ibuf[0xc9] = 0;
  local_2a0.ibuf[0xca] = 0;
  local_2a0.ibuf[0xcb] = 0;
  local_2a0.ibuf[0xcc] = 0;
  local_2a0.ibuf[0xcd] = 0;
  local_2a0.ibuf[0xce] = 0;
  local_2a0.ibuf[0xcf] = 0;
  local_2a0.ibuf[0xd0] = 0;
  local_2a0.ibuf[0xd1] = 0;
  local_2a0.ibuf[0xd2] = 0;
  local_2a0.ibuf[0xd3] = 0;
  local_2a0.ibuf[0xd4] = 0;
  local_2a0.ibuf[0xd5] = 0;
  local_2a0.ibuf[0xd6] = 0;
  local_2a0.ibuf[0xd7] = 0;
  local_2a0.ibuf[0xd8] = 0;
  local_2a0.ibuf[0xd9] = 0;
  local_2a0.ibuf[0xda] = 0;
  local_2a0.ibuf[0xdb] = 0;
  local_2a0.ibuf[0xdc] = 0;
  local_2a0.ibuf[0xdd] = 0;
  local_2a0.ibuf[0xde] = 0;
  local_2a0.ibuf[0xdf] = 0;
  local_2a0.ibuf[0xa0] = 0;
  local_2a0.ibuf[0xa1] = 0;
  local_2a0.ibuf[0xa2] = 0;
  local_2a0.ibuf[0xa3] = 0;
  local_2a0.ibuf[0xa4] = 0;
  local_2a0.ibuf[0xa5] = 0;
  local_2a0.ibuf[0xa6] = 0;
  local_2a0.ibuf[0xa7] = 0;
  local_2a0.ibuf[0xa8] = 0;
  local_2a0.ibuf[0xa9] = 0;
  local_2a0.ibuf[0xaa] = 0;
  local_2a0.ibuf[0xab] = 0;
  local_2a0.ibuf[0xac] = 0;
  local_2a0.ibuf[0xad] = 0;
  local_2a0.ibuf[0xae] = 0;
  local_2a0.ibuf[0xaf] = 0;
  local_2a0.ibuf[0xb0] = 0;
  local_2a0.ibuf[0xb1] = 0;
  local_2a0.ibuf[0xb2] = 0;
  local_2a0.ibuf[0xb3] = 0;
  local_2a0.ibuf[0xb4] = 0;
  local_2a0.ibuf[0xb5] = 0;
  local_2a0.ibuf[0xb6] = 0;
  local_2a0.ibuf[0xb7] = 0;
  local_2a0.ibuf[0xb8] = 0;
  local_2a0.ibuf[0xb9] = 0;
  local_2a0.ibuf[0xba] = 0;
  local_2a0.ibuf[0xbb] = 0;
  local_2a0.ibuf[0xbc] = 0;
  local_2a0.ibuf[0xbd] = 0;
  local_2a0.ibuf[0xbe] = 0;
  local_2a0.ibuf[0xbf] = 0;
  local_2a0.ibuf[0x80] = 0;
  local_2a0.ibuf[0x81] = 0;
  local_2a0.ibuf[0x82] = 0;
  local_2a0.ibuf[0x83] = 0;
  local_2a0.ibuf[0x84] = 0;
  local_2a0.ibuf[0x85] = 0;
  local_2a0.ibuf[0x86] = 0;
  local_2a0.ibuf[0x87] = 0;
  local_2a0.ibuf[0x88] = 0;
  local_2a0.ibuf[0x89] = 0;
  local_2a0.ibuf[0x8a] = 0;
  local_2a0.ibuf[0x8b] = 0;
  local_2a0.ibuf[0x8c] = 0;
  local_2a0.ibuf[0x8d] = 0;
  local_2a0.ibuf[0x8e] = 0;
  local_2a0.ibuf[0x8f] = 0;
  local_2a0.ibuf[0x90] = 0;
  local_2a0.ibuf[0x91] = 0;
  local_2a0.ibuf[0x92] = 0;
  local_2a0.ibuf[0x93] = 0;
  local_2a0.ibuf[0x94] = 0;
  local_2a0.ibuf[0x95] = 0;
  local_2a0.ibuf[0x96] = 0;
  local_2a0.ibuf[0x97] = 0;
  local_2a0.ibuf[0x98] = 0;
  local_2a0.ibuf[0x99] = 0;
  local_2a0.ibuf[0x9a] = 0;
  local_2a0.ibuf[0x9b] = 0;
  local_2a0.ibuf[0x9c] = 0;
  local_2a0.ibuf[0x9d] = 0;
  local_2a0.ibuf[0x9e] = 0;
  local_2a0.ibuf[0x9f] = 0;
  local_2a0.ibuf[0x60] = 0;
  local_2a0.ibuf[0x61] = 0;
  local_2a0.ibuf[0x62] = 0;
  local_2a0.ibuf[99] = 0;
  local_2a0.ibuf[100] = 0;
  local_2a0.ibuf[0x65] = 0;
  local_2a0.ibuf[0x66] = 0;
  local_2a0.ibuf[0x67] = 0;
  local_2a0.ibuf[0x68] = 0;
  local_2a0.ibuf[0x69] = 0;
  local_2a0.ibuf[0x6a] = 0;
  local_2a0.ibuf[0x6b] = 0;
  local_2a0.ibuf[0x6c] = 0;
  local_2a0.ibuf[0x6d] = 0;
  local_2a0.ibuf[0x6e] = 0;
  local_2a0.ibuf[0x6f] = 0;
  local_2a0.ibuf[0x70] = 0;
  local_2a0.ibuf[0x71] = 0;
  local_2a0.ibuf[0x72] = 0;
  local_2a0.ibuf[0x73] = 0;
  local_2a0.ibuf[0x74] = 0;
  local_2a0.ibuf[0x75] = 0;
  local_2a0.ibuf[0x76] = 0;
  local_2a0.ibuf[0x77] = 0;
  local_2a0.ibuf[0x78] = 0;
  local_2a0.ibuf[0x79] = 0;
  local_2a0.ibuf[0x7a] = 0;
  local_2a0.ibuf[0x7b] = 0;
  local_2a0.ibuf[0x7c] = 0;
  local_2a0.ibuf[0x7d] = 0;
  local_2a0.ibuf[0x7e] = 0;
  local_2a0.ibuf[0x7f] = 0;
  local_2a0.ibuf[0x40] = 0;
  local_2a0.ibuf[0x41] = 0;
  local_2a0.ibuf[0x42] = 0;
  local_2a0.ibuf[0x43] = 0;
  local_2a0.ibuf[0x44] = 0;
  local_2a0.ibuf[0x45] = 0;
  local_2a0.ibuf[0x46] = 0;
  local_2a0.ibuf[0x47] = 0;
  local_2a0.ibuf[0x48] = 0;
  local_2a0.ibuf[0x49] = 0;
  local_2a0.ibuf[0x4a] = 0;
  local_2a0.ibuf[0x4b] = 0;
  local_2a0.ibuf[0x4c] = 0;
  local_2a0.ibuf[0x4d] = 0;
  local_2a0.ibuf[0x4e] = 0;
  local_2a0.ibuf[0x4f] = 0;
  local_2a0.ibuf[0x50] = 0;
  local_2a0.ibuf[0x51] = 0;
  local_2a0.ibuf[0x52] = 0;
  local_2a0.ibuf[0x53] = 0;
  local_2a0.ibuf[0x54] = 0;
  local_2a0.ibuf[0x55] = 0;
  local_2a0.ibuf[0x56] = 0;
  local_2a0.ibuf[0x57] = 0;
  local_2a0.ibuf[0x58] = 0;
  local_2a0.ibuf[0x59] = 0;
  local_2a0.ibuf[0x5a] = 0;
  local_2a0.ibuf[0x5b] = 0;
  local_2a0.ibuf[0x5c] = 0;
  local_2a0.ibuf[0x5d] = 0;
  local_2a0.ibuf[0x5e] = 0;
  local_2a0.ibuf[0x5f] = 0;
  local_2a0.ibuf[0x20] = 0;
  local_2a0.ibuf[0x21] = 0;
  local_2a0.ibuf[0x22] = 0;
  local_2a0.ibuf[0x23] = 0;
  local_2a0.ibuf[0x24] = 0;
  local_2a0.ibuf[0x25] = 0;
  local_2a0.ibuf[0x26] = 0;
  local_2a0.ibuf[0x27] = 0;
  local_2a0.ibuf[0x28] = 0;
  local_2a0.ibuf[0x29] = 0;
  local_2a0.ibuf[0x2a] = 0;
  local_2a0.ibuf[0x2b] = 0;
  local_2a0.ibuf[0x2c] = 0;
  local_2a0.ibuf[0x2d] = 0;
  local_2a0.ibuf[0x2e] = 0;
  local_2a0.ibuf[0x2f] = 0;
  local_2a0.ibuf[0x30] = 0;
  local_2a0.ibuf[0x31] = 0;
  local_2a0.ibuf[0x32] = 0;
  local_2a0.ibuf[0x33] = 0;
  local_2a0.ibuf[0x34] = 0;
  local_2a0.ibuf[0x35] = 0;
  local_2a0.ibuf[0x36] = 0;
  local_2a0.ibuf[0x37] = 0;
  local_2a0.ibuf[0x38] = 0;
  local_2a0.ibuf[0x39] = 0;
  local_2a0.ibuf[0x3a] = 0;
  local_2a0.ibuf[0x3b] = 0;
  local_2a0.ibuf[0x3c] = 0;
  local_2a0.ibuf[0x3d] = 0;
  local_2a0.ibuf[0x3e] = 0;
  local_2a0.ibuf[0x3f] = 0;
  local_2a0.ibuf[0] = 0;
  local_2a0.ibuf[1] = 0;
  local_2a0.ibuf[2] = 0;
  local_2a0.ibuf[3] = 0;
  local_2a0.ibuf[4] = 0;
  local_2a0.ibuf[5] = 0;
  local_2a0.ibuf[6] = 0;
  local_2a0.ibuf[7] = 0;
  local_2a0.ibuf[8] = 0;
  local_2a0.ibuf[9] = 0;
  local_2a0.ibuf[10] = 0;
  local_2a0.ibuf[0xb] = 0;
  local_2a0.ibuf[0xc] = 0;
  local_2a0.ibuf[0xd] = 0;
  local_2a0.ibuf[0xe] = 0;
  local_2a0.ibuf[0xf] = 0;
  local_2a0.ibuf[0x10] = 0;
  local_2a0.ibuf[0x11] = 0;
  local_2a0.ibuf[0x12] = 0;
  local_2a0.ibuf[0x13] = 0;
  local_2a0.ibuf[0x14] = 0;
  local_2a0.ibuf[0x15] = 0;
  local_2a0.ibuf[0x16] = 0;
  local_2a0.ibuf[0x17] = 0;
  local_2a0.ibuf[0x18] = 0;
  local_2a0.ibuf[0x19] = 0;
  local_2a0.ibuf[0x1a] = 0;
  local_2a0.ibuf[0x1b] = 0;
  local_2a0.ibuf[0x1c] = 0;
  local_2a0.ibuf[0x1d] = 0;
  local_2a0.ibuf[0x1e] = 0;
  local_2a0.ibuf[0x1f] = 0;
  unodb::key_encoder::key_encoder(&local_2a0);
  pkVar4 = unodb::key_encoder::encode((key_encoder *)local_180,local_34[0]);
  local_2b0 = unodb::key_encoder::get_key_view(pkVar4);
  pkVar4 = unodb::key_encoder::encode(&local_2a0,local_38);
  local_2c0 = unodb::key_encoder::get_key_view(pkVar4);
  local_2f0 = local_2b0._M_ptr;
  sStack_2e8 = local_2b0._M_extent._M_extent_value;
  local_300 = local_2b0._M_ptr;
  sStack_2f8 = local_2b0._M_extent._M_extent_value;
  local_2d4 = unodb::detail::compare(local_2b0,local_2b0);
  local_304 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)&local_2d0,"(compare(ikey1, ikey1))","(0)",&local_2d4,&local_304);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar3 = testing::AssertionResult::failure_message(&local_2d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult(&local_2d0);
  local_340 = local_2c0._M_ptr;
  sStack_338 = local_2c0._M_extent._M_extent_value;
  local_350 = local_2c0._M_ptr;
  sStack_348 = local_2c0._M_extent._M_extent_value;
  local_32c = unodb::detail::compare(local_2c0,local_2c0);
  local_354 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)&local_328,"(compare(ikey2, ikey2))","(0)",&local_32c,&local_354);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar3 = testing::AssertionResult::failure_message(&local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult(&local_328);
  local_390 = local_2b0._M_ptr;
  sStack_388 = local_2b0._M_extent._M_extent_value;
  local_3a0 = local_2c0._M_ptr;
  sStack_398 = local_2c0._M_extent._M_extent_value;
  local_37c = unodb::detail::compare(local_2b0,local_2c0);
  local_3a4 = 0;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&local_378,"(compare(ikey1, ikey2))","(0)",&local_37c,&local_3a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar3 = testing::AssertionResult::failure_message(&local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult(&local_378);
  local_3c8 = local_2b0._M_ptr;
  local_3c0 = local_2b0._M_extent._M_extent_value;
  local_3d8 = local_2c0._M_ptr;
  local_3d0 = local_2c0._M_extent._M_extent_value;
  _Var6._M_extent_value = local_2c0._M_extent._M_extent_value;
  iVar2 = unodb::detail::compare(local_2b0,local_2c0);
  if (iVar2 < 0) {
    local_790 = local_2c0._M_ptr;
    sStack_788 = local_2c0._M_extent._M_extent_value;
    local_7a0 = local_2b0._M_ptr;
    sStack_798 = local_2b0._M_extent._M_extent_value;
    local_77c = unodb::detail::compare(local_2c0,local_2b0);
    local_7a4 = 0;
    testing::internal::CmpHelperGT<int,int>
              ((internal *)&local_778,"(compare(ikey2, ikey1))","(0)",&local_77c,&local_7a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
    if (!bVar1) {
      testing::Message::Message(&local_7b0);
      pcVar3 = testing::AssertionResult::failure_message(&local_778);
      testing::internal::AssertHelper::AssertHelper
                (&local_7b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x58,pcVar3);
      testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
      testing::internal::AssertHelper::~AssertHelper(&local_7b8);
      testing::Message::~Message(&local_7b0);
    }
    testing::AssertionResult::~AssertionResult(&local_778);
    local_7e0 = local_2b0._M_ptr;
    sStack_7d8 = local_2b0._M_extent._M_extent_value;
    unodb::key_decoder::key_decoder(&local_7d0,local_2b0);
    local_810 = local_2c0._M_ptr;
    sStack_808 = local_2c0._M_extent._M_extent_value;
    unodb::key_decoder::key_decoder(&local_7f8,local_2c0);
    unodb::key_decoder::decode(&local_7d0,&local_814);
    unodb::key_decoder::decode(&local_7f8,&local_818);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)&local_828,"(ekey1)","(akey1)",local_34,&local_814);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_828);
    if (!bVar1) {
      testing::Message::Message(&local_830);
      pcVar3 = testing::AssertionResult::failure_message(&local_828);
      testing::internal::AssertHelper::AssertHelper
                (&local_838,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x60,pcVar3);
      testing::internal::AssertHelper::operator=(&local_838,&local_830);
      testing::internal::AssertHelper::~AssertHelper(&local_838);
      testing::Message::~Message(&local_830);
    }
    testing::AssertionResult::~AssertionResult(&local_828);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)&local_848,"(ekey2)","(akey2)",&local_38,&local_818);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_848);
    if (!bVar1) {
      testing::Message::Message(&local_850);
      pcVar3 = testing::AssertionResult::failure_message(&local_848);
      testing::internal::AssertHelper::AssertHelper
                (&local_858,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x61,pcVar3);
      testing::internal::AssertHelper::operator=(&local_858,&local_850);
      testing::internal::AssertHelper::~AssertHelper(&local_858);
      testing::Message::~Message(&local_850);
    }
    testing::AssertionResult::~AssertionResult(&local_848);
    local_764 = 0;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_560);
    std::__cxx11::stringstream::stringstream(local_6e8);
    local_700 = (ostream *)local_2b0._M_ptr;
    pbStack_6f8 = (pointer)local_2b0._M_extent._M_extent_value;
    key._M_extent._M_extent_value = _Var6._M_extent_value;
    key._M_ptr = (pointer)local_2b0._M_extent._M_extent_value;
    unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              (local_550,(ostream *)local_2b0._M_ptr,key);
    local_710 = (ostream *)local_2c0._M_ptr;
    pbStack_708 = (pointer)local_2c0._M_extent._M_extent_value;
    key_00._M_extent._M_extent_value = _Var6._M_extent_value;
    key_00._M_ptr = (pointer)local_2c0._M_extent._M_extent_value;
    unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              (local_6d8,(ostream *)local_2c0._M_ptr,key_00);
    testing::Message::Message(&local_718);
    pMVar5 = testing::Message::operator<<(&local_718,(char (*) [14])"ikey1 < ikey2");
    pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [9])": ekey1(");
    pMVar5 = testing::Message::operator<<(pMVar5,local_34);
    pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [3])")[");
    std::__cxx11::stringstream::str();
    pMVar5 = testing::Message::operator<<(pMVar5,&local_738);
    pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [2])0x192fd8);
    pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [9])", ekey2(");
    pMVar5 = testing::Message::operator<<(pMVar5,&local_38);
    pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [3])")[");
    std::__cxx11::stringstream::str();
    pMVar5 = testing::Message::operator<<(pMVar5,&local_758);
    pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [2])0x192fd8);
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x51,"Failed");
    testing::internal::AssertHelper::operator=(&local_760,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)&local_738);
    testing::Message::~Message(&local_718);
    local_764 = 1;
    std::__cxx11::stringstream::~stringstream(local_6e8);
    std::__cxx11::stringstream::~stringstream(local_560);
  }
  unodb::key_encoder::~key_encoder(&local_2a0);
  unodb::key_encoder::~key_encoder((key_encoder *)local_180);
  return;
}

Assistant:

void do_encode_decode_lt_test(const T ekey1, const T ekey2) {
  if constexpr (std::is_same_v<T, float> || std::is_same_v<T, double>) {
    // Note: floating point +0 and -0 compare as equal, so we do not
    // compare the keys for non-quality if one of the keys is zero.
    if (std::fpclassify(ekey1) != FP_ZERO) {
      UNODB_EXPECT_NE(ekey1, ekey2);  // not the same ekey.
    }
  } else {
    UNODB_EXPECT_NE(ekey1, ekey2);  // not the same ekey.
  }
  unodb::key_encoder enc1{};
  unodb::key_encoder enc2{};  // separate decoder (backed by different span).
  const auto ikey1 = enc1.encode(ekey1).get_key_view();  // into encoder buf!
  const auto ikey2 = enc2.encode(ekey2).get_key_view();  // into encoder buf!
  UNODB_EXPECT_EQ(compare(ikey1, ikey1), 0);             // compare w/ self
  UNODB_EXPECT_EQ(compare(ikey2, ikey2), 0);             // compare w/ self
  UNODB_EXPECT_NE(compare(ikey1, ikey2), 0);             // not the same ikey.
  // Check the core assertion for this test helper. The internal keys
  // (after encoding) obey the asserted ordering over the external
  // keys (before encoding).
  if (!(compare(ikey1, ikey2) < 0)) {
    // LCOV_EXCL_START
    std::stringstream ss1;
    std::stringstream ss2;
    unodb::detail::dump_key(ss1, ikey1);
    unodb::detail::dump_key(ss2, ikey2);
    FAIL() << "ikey1 < ikey2"
           << ": ekey1(" << ekey1 << ")[" << ss1.str() << "]"
           << ", ekey2(" << ekey2 << ")[" << ss2.str() << "]";
    // LCOV_EXCL_START
  }
  // Verify key2 > key1
  // NOLINTNEXTLINE(readability/check)
  UNODB_EXPECT_GT(compare(ikey2, ikey1), 0);
  // Verify that we can round trip both values.
  unodb::key_decoder dec1{ikey1};
  unodb::key_decoder dec2{ikey2};
  T akey1;
  T akey2;
  dec1.decode(akey1);
  dec2.decode(akey2);
  UNODB_EXPECT_EQ(ekey1, akey1);
  UNODB_EXPECT_EQ(ekey2, akey2);
}